

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::moveVecToPtr
          (RACFGBuilder *this,InvokeNode *invokeNode,FuncValue *arg,Vec *src,BaseReg *out)

{
  byte bVar1;
  long lVar2;
  BaseCompiler *this_00;
  Error EVar3;
  TypeId *pTVar4;
  VirtReg *pVVar5;
  InstId instId;
  byte bVar6;
  uint32_t uVar7;
  uint uVar8;
  Mem vecPtr;
  Vec vecReg;
  Mem stackPtr;
  
  if ((arg->_data >> 8 & 1) == 0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/x86rapass.cpp"
               ,0x2ed,"arg.isReg()");
  }
  bVar1 = TypeUtils::_typeData[(ulong)(arg->_data & 0xff) + 0x100];
  if (bVar1 == 0) {
    EVar3 = 3;
  }
  else {
    bVar6 = 0x10;
    if (0x10 < bVar1) {
      bVar6 = bVar1;
    }
    uVar8 = (uint)bVar6;
    vecPtr.super_BaseMem.super_Operand.super_Operand_._data[1] =
         -uVar8 & (uVar8 + *(int *)&invokeNode->field_0x108) - 1;
    lVar2 = *(long *)(this + 0x20);
    if (bVar6 < *(byte *)(lVar2 + 0x2db)) {
      bVar6 = *(byte *)(lVar2 + 0x2db);
    }
    *(byte *)(lVar2 + 0x2db) = bVar6;
    if (bVar6 < *(byte *)(lVar2 + 0x2dd)) {
      bVar6 = *(byte *)(lVar2 + 0x2dd);
    }
    *(byte *)(lVar2 + 0x2dd) = bVar6;
    *(uint *)&invokeNode->field_0x108 =
         uVar8 + vecPtr.super_BaseMem.super_Operand.super_Operand_._data[1];
    uVar7 = 0x10000161;
    if (0x1f < bVar1) {
      uVar7 = 0x20000169;
    }
    vecReg.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits = 0x40000171;
    if (bVar1 < 0x40) {
      vecReg.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits = uVar7;
    }
    vecReg.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId =
         (src->super_Reg).super_BaseReg.super_Operand.super_Operand_._baseId;
    vecReg.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
    vecReg.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
    vecPtr.super_BaseMem.super_Operand.super_Operand_._signature._bits =
         *(uint *)(*(long *)this + 0x1d8) & 0xf8 | 2;
    vecPtr.super_BaseMem.super_Operand.super_Operand_._baseId = *(uint32_t *)(*(long *)this + 0x1dc)
    ;
    vecPtr.super_BaseMem.super_Operand.super_Operand_._data[0] = 0;
    instId = 0x1ba;
    if (((byte)this[0x292] & 1) != 0) {
      instId = 0x4a9;
    }
    if (0x10 < bVar1) {
      instId = 0x4a9;
    }
    this_00 = *(BaseCompiler **)(this + 8);
    stackPtr.super_BaseMem.super_Operand.super_Operand_._signature._bits._0_1_ =
         (byte)(this_00->super_BaseBuilder).super_BaseEmitter._gpSignature._bits >> 3;
    pTVar4 = Support::Array<asmjit::v1_14::TypeId,_32UL>::operator[]<asmjit::v1_14::RegType>
                       ((Array<asmjit::v1_14::TypeId,_32UL> *)
                        (_archTraits +
                        (ulong)(this_00->super_BaseBuilder).super_BaseEmitter._environment._arch *
                        0xd8 + 0x94),(RegType *)&stackPtr);
    EVar3 = BaseCompiler::_newReg(this_00,out,*pTVar4,(char *)0x0);
    if (EVar3 == 0) {
      pVVar5 = BaseCompiler::virtRegById
                         (*(BaseCompiler **)(this + 8),(out->super_Operand).super_Operand_._baseId);
      pVVar5[0xe] = (VirtReg)0x50;
      EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::lea
                        (*(EmitterExplicitT<asmjit::v1_14::x86::Compiler> **)(this + 8),(Gp *)out,
                         &vecPtr);
      if (EVar3 == 0) {
        stackPtr.super_BaseMem.super_Operand.super_Operand_._signature._bits =
             (out->super_Operand).super_Operand_._signature._bits & 0xf8 | 2;
        stackPtr.super_BaseMem.super_Operand.super_Operand_._baseId =
             (out->super_Operand).super_Operand_._baseId;
        stackPtr.super_BaseMem.super_Operand.super_Operand_._data[0] = 0;
        stackPtr.super_BaseMem.super_Operand.super_Operand_._data[1] = 0;
        EVar3 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),instId,(Operand_ *)&stackPtr,
                                    (Operand_ *)&vecReg);
        if (EVar3 == 0) {
          if ((arg->_data >> 9 & 1) != 0) {
            stackPtr.super_BaseMem.super_Operand.super_Operand_._signature._bits =
                 *(uint *)(*(long *)this + 0x1d8) & 0xf8 | 2;
            stackPtr.super_BaseMem.super_Operand.super_Operand_._baseId =
                 *(uint32_t *)(*(long *)this + 0x1dc);
            stackPtr.super_BaseMem.super_Operand.super_Operand_._data =
                 (uint32_t  [2])((ulong)(uint)((int)arg->_data >> 0xc) << 0x20);
            EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::mov
                              (*(EmitterExplicitT<asmjit::v1_14::x86::Compiler> **)(this + 8),
                               &stackPtr,(Gp *)out);
            if (EVar3 != 0) {
              return EVar3;
            }
          }
          EVar3 = 0;
        }
      }
    }
  }
  return EVar3;
}

Assistant:

Error RACFGBuilder::moveVecToPtr(InvokeNode* invokeNode, const FuncValue& arg, const Vec& src, BaseReg* out) noexcept {
  DebugUtils::unused(invokeNode);
  ASMJIT_ASSERT(arg.isReg());

  uint32_t argSize = TypeUtils::sizeOf(arg.typeId());
  if (argSize == 0)
    return DebugUtils::errored(kErrorInvalidState);

  if (argSize < 16)
    argSize = 16;

  uint32_t argStackOffset = Support::alignUp(invokeNode->detail()._argStackSize, argSize);
  _funcNode->frame().updateCallStackAlignment(argSize);
  invokeNode->detail()._argStackSize = argStackOffset + argSize;

  Vec vecReg(x86VecRegSignatureBySize(argSize), src.id());
  Mem vecPtr = ptr(_pass->_sp.as<Gp>(), int32_t(argStackOffset));

  uint32_t vMovInstId = choose(Inst::kIdMovaps, Inst::kIdVmovaps);
  if (argSize > 16)
    vMovInstId = Inst::kIdVmovaps;

  ASMJIT_PROPAGATE(cc()->_newReg(out, ArchTraits::byArch(cc()->arch()).regTypeToTypeId(cc()->_gpSignature.regType()), nullptr));

  VirtReg* vReg = cc()->virtRegById(out->id());
  vReg->setWeight(BaseRAPass::kCallArgWeight);

  ASMJIT_PROPAGATE(cc()->lea(out->as<Gp>(), vecPtr));
  ASMJIT_PROPAGATE(cc()->emit(vMovInstId, ptr(out->as<Gp>()), vecReg));

  if (arg.isStack()) {
    Mem stackPtr = ptr(_pass->_sp.as<Gp>(), arg.stackOffset());
    ASMJIT_PROPAGATE(cc()->mov(stackPtr, out->as<Gp>()));
  }

  return kErrorOk;
}